

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImg<unsigned_char> *__return_storage_ptr__,CImgList<unsigned_char> *this,char axis,
          float align)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  CImg<unsigned_char> *pCVar4;
  void *pvVar5;
  char cVar6;
  long lVar7;
  CImg<unsigned_char> *pCVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int l;
  long lVar13;
  int l_2;
  uint uVar14;
  uchar local_4c [4];
  CImg<unsigned_char> *local_48;
  CImgList<unsigned_char> *local_40;
  float local_34;
  
  pCVar8 = this->_data;
  uVar10 = this->_width;
  if (uVar10 == 0 || pCVar8 == (CImg<unsigned_char> *)0x0) {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else {
    uVar11 = (ulong)uVar10;
    local_40 = this;
    local_34 = align;
    if (uVar10 == 1) {
      CImg<unsigned_char>::CImg(__return_storage_ptr__,pCVar8,false);
    }
    else {
      __return_storage_ptr__->_data = (uchar *)0x0;
      __return_storage_ptr__->_width = 0;
      __return_storage_ptr__->_height = 0;
      __return_storage_ptr__->_depth = 0;
      __return_storage_ptr__->_spectrum = 0;
      __return_storage_ptr__->_is_shared = false;
      cVar6 = axis + ' ';
      if ((byte)(axis + 0xa5U) < 0xe6) {
        cVar6 = axis;
      }
      local_48 = __return_storage_ptr__;
      if (cVar6 == 'x') {
        if ((int)uVar10 < 1) {
          uVar9 = 0;
          uVar12 = 0;
          uVar10 = 0;
          uVar14 = 0;
        }
        else {
          lVar7 = 0;
          uVar14 = 0;
          uVar10 = 0;
          uVar12 = 0;
          uVar9 = 0;
          do {
            if (*(long *)((long)&pCVar8->_data + lVar7) != 0) {
              uVar9 = uVar9 + *(int *)((long)&pCVar8->_width + lVar7);
              uVar1 = *(uint *)((long)&pCVar8->_height + lVar7);
              uVar2 = *(uint *)((long)&pCVar8->_depth + lVar7);
              if (uVar12 <= uVar1) {
                uVar12 = uVar1;
              }
              if (uVar10 <= uVar2) {
                uVar10 = uVar2;
              }
              uVar1 = *(uint *)((long)&pCVar8->_spectrum + lVar7);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
            }
            lVar7 = lVar7 + 0x20;
          } while (uVar11 << 5 != lVar7);
        }
        local_4c[3] = 0;
        pCVar8 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar9,uVar12,uVar10,uVar14);
        CImg<unsigned_char>::fill(pCVar8,local_4c + 3);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar7 = 0;
          lVar13 = 0;
          uVar11 = 0;
          do {
            pCVar4 = local_40->_data;
            pCVar8 = (CImg<unsigned_char> *)((long)&pCVar4->_width + lVar7);
            pvVar5 = *(void **)((long)&pCVar4->_data + lVar7);
            if (pvVar5 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar4->_height + lVar7);
              if ((((iVar3 == 1) && (*(int *)((long)&pCVar4->_depth + lVar7) == 1)) &&
                  (*(int *)((long)&pCVar4->_spectrum + lVar7) == 1)) &&
                 (((local_48->_height == 1 && (local_48->_depth == 1)) && (local_48->_spectrum == 1)
                  ))) {
                memcpy(local_48->_data + uVar11,pvVar5,(ulong)pCVar8->_width);
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)uVar11,(int)((float)(uVar12 - iVar3) * local_34),
                           (int)((float)(uVar10 - *(int *)((long)&pCVar4->_depth + lVar7)) *
                                local_34),
                           (int)((float)(uVar14 - *(int *)((long)&pCVar4->_spectrum + lVar7)) *
                                local_34),pCVar8,1.0);
              }
            }
            uVar11 = (ulong)((int)uVar11 + pCVar8->_width);
            lVar13 = lVar13 + 1;
            lVar7 = lVar7 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar13 < (int)local_40->_width);
        }
      }
      else if (cVar6 == 'y') {
        if ((int)uVar10 < 1) {
          uVar10 = 0;
          uVar9 = 0;
          uVar12 = 0;
          uVar14 = 0;
        }
        else {
          lVar7 = 0;
          uVar14 = 0;
          uVar12 = 0;
          uVar9 = 0;
          uVar10 = 0;
          do {
            if (*(long *)((long)&pCVar8->_data + lVar7) != 0) {
              uVar1 = *(uint *)((long)&pCVar8->_width + lVar7);
              if (uVar10 <= uVar1) {
                uVar10 = uVar1;
              }
              uVar1 = *(uint *)((long)&pCVar8->_depth + lVar7);
              uVar9 = uVar9 + *(int *)((long)&pCVar8->_height + lVar7);
              if (uVar12 <= uVar1) {
                uVar12 = uVar1;
              }
              uVar1 = *(uint *)((long)&pCVar8->_spectrum + lVar7);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
            }
            lVar7 = lVar7 + 0x20;
          } while (uVar11 << 5 != lVar7);
        }
        local_4c[2] = 0;
        pCVar8 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar10,uVar9,uVar12,uVar14);
        CImg<unsigned_char>::fill(pCVar8,local_4c + 2);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar7 = 0;
          lVar13 = 0;
          uVar11 = 0;
          do {
            pCVar8 = local_40->_data;
            pvVar5 = *(void **)((long)&pCVar8->_data + lVar7);
            if (pvVar5 != (void *)0x0) {
              pCVar4 = (CImg<unsigned_char> *)((long)&pCVar8->_width + lVar7);
              uVar9 = pCVar4->_width;
              if (((((uVar9 == 1) && (*(int *)((long)&pCVar8->_depth + lVar7) == 1)) &&
                   (*(int *)((long)&pCVar8->_spectrum + lVar7) == 1)) &&
                  ((local_48->_width == 1 && (local_48->_depth == 1)))) &&
                 (local_48->_spectrum == 1)) {
                memcpy(local_48->_data + uVar11,pvVar5,
                       (ulong)*(uint *)((long)&pCVar8->_height + lVar7));
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)((float)(uVar10 - uVar9) * local_34),(int)uVar11,
                           (int)((float)(uVar12 - *(int *)((long)&pCVar8->_depth + lVar7)) *
                                local_34),
                           (int)((float)(uVar14 - *(int *)((long)&pCVar8->_spectrum + lVar7)) *
                                local_34),pCVar4,1.0);
              }
            }
            uVar11 = (ulong)(uint)((int)uVar11 + *(int *)((long)&pCVar8->_height + lVar7));
            lVar13 = lVar13 + 1;
            lVar7 = lVar7 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar13 < (int)local_40->_width);
        }
      }
      else if (cVar6 == 'z') {
        if ((int)uVar10 < 1) {
          uVar10 = 0;
          uVar12 = 0;
          uVar9 = 0;
          uVar14 = 0;
        }
        else {
          lVar7 = 0;
          uVar14 = 0;
          uVar9 = 0;
          uVar12 = 0;
          uVar10 = 0;
          do {
            if (*(long *)((long)&pCVar8->_data + lVar7) != 0) {
              uVar1 = *(uint *)((long)&pCVar8->_width + lVar7);
              uVar2 = *(uint *)((long)&pCVar8->_height + lVar7);
              if (uVar10 <= uVar1) {
                uVar10 = uVar1;
              }
              if (uVar12 <= uVar2) {
                uVar12 = uVar2;
              }
              uVar9 = uVar9 + *(int *)((long)&pCVar8->_depth + lVar7);
              uVar1 = *(uint *)((long)&pCVar8->_spectrum + lVar7);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
            }
            lVar7 = lVar7 + 0x20;
          } while (uVar11 << 5 != lVar7);
        }
        local_4c[1] = 0;
        pCVar8 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar10,uVar12,uVar9,uVar14);
        CImg<unsigned_char>::fill(pCVar8,local_4c + 1);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar7 = 0;
          lVar13 = 0;
          uVar11 = 0;
          do {
            pCVar8 = local_40->_data;
            pvVar5 = *(void **)((long)&pCVar8->_data + lVar7);
            if (pvVar5 != (void *)0x0) {
              pCVar4 = (CImg<unsigned_char> *)((long)&pCVar8->_width + lVar7);
              uVar9 = pCVar4->_width;
              if (((((uVar9 == 1) && (*(int *)((long)&pCVar8->_height + lVar7) == 1)) &&
                   (*(int *)((long)&pCVar8->_spectrum + lVar7) == 1)) &&
                  ((local_48->_width == 1 && (local_48->_height == 1)))) &&
                 (local_48->_spectrum == 1)) {
                memcpy(local_48->_data + uVar11,pvVar5,
                       (ulong)*(uint *)((long)&pCVar8->_depth + lVar7));
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)((float)(uVar10 - uVar9) * local_34),
                           (int)((float)(uVar12 - *(int *)((long)&pCVar8->_height + lVar7)) *
                                local_34),(int)uVar11,
                           (int)((float)(uVar14 - *(int *)((long)&pCVar8->_spectrum + lVar7)) *
                                local_34),pCVar4,1.0);
              }
            }
            uVar11 = (ulong)(uint)((int)uVar11 + *(int *)((long)&pCVar8->_depth + lVar7));
            lVar13 = lVar13 + 1;
            lVar7 = lVar7 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar13 < (int)local_40->_width);
        }
      }
      else {
        if ((int)uVar10 < 1) {
          uVar10 = 0;
          uVar12 = 0;
          uVar14 = 0;
          uVar9 = 0;
        }
        else {
          lVar7 = 0;
          uVar9 = 0;
          uVar14 = 0;
          uVar12 = 0;
          uVar10 = 0;
          do {
            if (*(long *)((long)&pCVar8->_data + lVar7) != 0) {
              uVar1 = *(uint *)((long)&pCVar8->_width + lVar7);
              uVar2 = *(uint *)((long)&pCVar8->_height + lVar7);
              if (uVar10 <= uVar1) {
                uVar10 = uVar1;
              }
              if (uVar12 <= uVar2) {
                uVar12 = uVar2;
              }
              uVar1 = *(uint *)((long)&pCVar8->_depth + lVar7);
              if (uVar14 <= uVar1) {
                uVar14 = uVar1;
              }
              uVar9 = uVar9 + *(int *)((long)&pCVar8->_spectrum + lVar7);
            }
            lVar7 = lVar7 + 0x20;
          } while (uVar11 << 5 != lVar7);
        }
        local_4c[0] = '\0';
        pCVar8 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar10,uVar12,uVar14,uVar9);
        CImg<unsigned_char>::fill(pCVar8,local_4c);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar7 = 0;
          lVar13 = 0;
          uVar11 = 0;
          do {
            pCVar8 = local_40->_data;
            pvVar5 = *(void **)((long)&pCVar8->_data + lVar7);
            if (pvVar5 != (void *)0x0) {
              pCVar4 = (CImg<unsigned_char> *)((long)&pCVar8->_width + lVar7);
              uVar9 = pCVar4->_width;
              if ((((uVar9 == 1) && (*(int *)((long)&pCVar8->_height + lVar7) == 1)) &&
                  (*(int *)((long)&pCVar8->_depth + lVar7) == 1)) &&
                 (((local_48->_width == 1 && (local_48->_height == 1)) && (local_48->_depth == 1))))
              {
                memcpy(local_48->_data + uVar11,pvVar5,
                       (ulong)*(uint *)((long)&pCVar8->_spectrum + lVar7));
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)((float)(uVar10 - uVar9) * local_34),
                           (int)((float)(uVar12 - *(int *)((long)&pCVar8->_height + lVar7)) *
                                local_34),
                           (int)((float)(uVar14 - *(int *)((long)&pCVar8->_depth + lVar7)) *
                                local_34),(int)uVar11,pCVar4,1.0);
              }
            }
            uVar11 = (ulong)(uint)((int)uVar11 + *(int *)((long)&pCVar8->_spectrum + lVar7));
            lVar13 = lVar13 + 1;
            lVar7 = lVar7 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar13 < (int)local_40->_width);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::lowercase(axis)) {
      case 'x' : { // Along the X-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._height==1 && img._depth==1 && img._spectrum==1 &&
                  res._height==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._width);
              else
                res.draw_image(pos,
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy+=img._height;
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._depth==1 && img._spectrum==1 &&
                  res._width==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._height);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               pos,
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz+=img._depth;
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._spectrum==1 &&
                  res._width==1 && res._height==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._depth);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               pos,
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._depth==1 &&
                  res._width==1 && res._height==1 && res._depth==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._spectrum);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               pos,
                               img);
            }
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }